

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,BilinearPatchMesh *mesh,int patchIndex,
          Point2f *uv,Float time,Vector3f *wo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Tuple2<pbrt::Point2,_float> TVar10;
  ulong uVar11;
  undefined4 uVar18;
  ulong uVar12;
  undefined8 uVar13;
  Point2f PVar14;
  Point2f PVar15;
  Point2f PVar16;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  ulong uVar17;
  bool bVar23;
  int iVar24;
  int *piVar25;
  Point3f *pPVar26;
  Point2f *pPVar27;
  Normal3f *pNVar28;
  float fVar29;
  ulong uVar30;
  float fVar31;
  long lVar32;
  int iVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Vector3f local_190;
  Vector3f local_180;
  Float local_170;
  Normal3f dndu;
  Point2f uvTex;
  Normal3f dndv;
  Tuple3<pbrt::Normal3,_float> local_130;
  Tuple3<pbrt::Vector3,_float> local_120;
  Tuple3<pbrt::Point3,_float> local_110;
  Tuple3<pbrt::Vector3,_float> local_100;
  Tuple3<pbrt::Vector3,_float> local_f0;
  Tuple3<pbrt::Normal3,_float> local_e0;
  Tuple3<pbrt::Normal3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  double vb;
  float local_a8;
  float local_a0;
  float local_9c;
  Float local_98;
  Float local_90;
  float local_8c;
  Float local_88;
  
  piVar25 = mesh->vertexIndices;
  pPVar26 = mesh->p;
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  TVar10 = uv->super_Tuple2<pbrt::Point2,_float>;
  auVar42._8_8_ = 0;
  auVar42._0_4_ = TVar10.x;
  auVar42._4_4_ = TVar10.y;
  lVar32 = (long)(patchIndex * 4);
  iVar33 = piVar25[lVar32 + 2];
  auVar39 = vshufps_avx(auVar42,auVar42,0x15);
  auVar35 = vbroadcastss_avx512vl(auVar42);
  auVar43 = vsubps_avx(auVar44,auVar42);
  fVar60 = pPVar26[iVar33].super_Tuple3<pbrt::Point3,_float>.z;
  uVar30._0_4_ = pPVar26[iVar33].super_Tuple3<pbrt::Point3,_float>.x;
  uVar30._4_4_ = pPVar26[iVar33].super_Tuple3<pbrt::Point3,_float>.y;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar30;
  fVar1 = pPVar26[piVar25[lVar32]].super_Tuple3<pbrt::Point3,_float>.z;
  uVar11._0_4_ = pPVar26[piVar25[lVar32]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar11._4_4_ = pPVar26[piVar25[lVar32]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar11;
  auVar40 = vshufps_avx(auVar43,auVar43,0x15);
  fVar31 = auVar43._0_4_;
  iVar24 = piVar25[lVar32 + 3];
  fVar2 = pPVar26[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Point3,_float>.z;
  uVar5 = pPVar26[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Point3,_float>.x;
  uVar18 = pPVar26[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Point3,_float>.y;
  auVar63._4_4_ = uVar18;
  auVar63._0_4_ = uVar5;
  auVar63._8_8_ = 0;
  auVar46 = vinsertps_avx(auVar53,ZEXT416((uint)fVar60),0x20);
  auVar36 = vshufps_avx512vl(auVar61,ZEXT416((uint)fVar1),4);
  fVar3 = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.z;
  uVar12._0_4_ = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.x;
  uVar12._4_4_ = pPVar26[iVar24].super_Tuple3<pbrt::Point3,_float>.y;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar12;
  auVar46 = vinsertps_avx512f(auVar46,ZEXT416((uint)fVar2),0x30);
  auVar37 = vmulps_avx512vl(auVar63,auVar35);
  auVar45._0_4_ = auVar46._0_4_ * auVar39._0_4_ + auVar36._0_4_ * auVar40._0_4_;
  auVar45._4_4_ = auVar46._4_4_ * auVar39._4_4_ + auVar36._4_4_ * auVar40._4_4_;
  auVar45._8_4_ = auVar46._8_4_ * auVar39._8_4_ + auVar36._8_4_ * auVar40._8_4_;
  auVar45._12_4_ = auVar46._12_4_ * auVar39._12_4_ + auVar36._12_4_ * auVar40._12_4_;
  auVar46 = vinsertps_avx512f(auVar63,ZEXT416((uint)fVar2),0x20);
  auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)fVar60),0x30);
  auVar38 = vshufps_avx512vl(auVar54,ZEXT416((uint)fVar3),4);
  auVar36 = vshufpd_avx(auVar45,auVar45,1);
  auVar41._0_4_ = auVar38._0_4_ * auVar39._0_4_ + auVar46._0_4_ * auVar40._0_4_;
  auVar41._4_4_ = auVar38._4_4_ * auVar39._4_4_ + auVar46._4_4_ * auVar40._4_4_;
  auVar41._8_4_ = auVar38._8_4_ * auVar39._8_4_ + auVar46._8_4_ * auVar40._8_4_;
  auVar41._12_4_ = auVar38._12_4_ * auVar39._12_4_ + auVar46._12_4_ * auVar40._12_4_;
  auVar46 = vinsertps_avx(auVar36,auVar41,0x9c);
  auVar39 = vmulps_avx512vl(auVar35,auVar41);
  auVar36 = vsubps_avx(auVar41,auVar45);
  uVar13 = vmovlps_avx(auVar36);
  local_180.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar13;
  local_180.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar13 >> 0x20);
  auVar40 = vpermi2ps_avx512vl(_DAT_004ffb60,auVar42,auVar43);
  auVar38._0_4_ = auVar40._0_4_ * auVar46._0_4_;
  auVar38._4_4_ = auVar40._4_4_ * auVar46._4_4_;
  auVar38._8_4_ = auVar40._8_4_ * auVar46._8_4_;
  auVar38._12_4_ = auVar40._12_4_ * auVar46._12_4_;
  auVar49._0_4_ = fVar31 * auVar45._0_4_;
  auVar49._4_4_ = fVar31 * auVar45._4_4_;
  auVar49._8_4_ = fVar31 * auVar45._8_4_;
  auVar49._12_4_ = fVar31 * auVar45._12_4_;
  auVar40 = vmulps_avx512vl(auVar54,auVar35);
  auVar46 = vhaddps_avx(auVar38,auVar38);
  auVar39 = vaddps_avx512vl(auVar49,auVar39);
  local_110._0_8_ = vmovlps_avx(auVar39);
  auVar39 = vshufpd_avx(auVar36,auVar36,1);
  local_110.z = auVar46._0_4_;
  local_180.super_Tuple3<pbrt::Vector3,_float>.z = auVar39._0_4_;
  auVar46._0_4_ = auVar40._0_4_ + fVar31 * (float)(undefined4)uVar30;
  auVar46._4_4_ = auVar40._4_4_ + fVar31 * (float)uVar30._4_4_;
  auVar46._8_4_ = auVar40._8_4_ + fVar31 * 0.0;
  auVar46._12_4_ = auVar40._12_4_ + fVar31 * 0.0;
  auVar35._0_4_ = fVar31 * (float)(undefined4)uVar11 + auVar37._0_4_;
  auVar35._4_4_ = fVar31 * (float)uVar11._4_4_ + auVar37._4_4_;
  auVar35._8_4_ = fVar31 * 0.0 + auVar37._8_4_;
  auVar35._12_4_ = fVar31 * 0.0 + auVar37._12_4_;
  auVar40 = vsubps_avx(auVar46,auVar35);
  auVar46 = vshufps_avx(auVar36,auVar36,0xff);
  local_190.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar40);
  local_190.super_Tuple3<pbrt::Vector3,_float>.z = auVar46._0_4_;
  uvTex = *(Point2f *)&uv->super_Tuple2<pbrt::Point2,_float>;
  pPVar27 = mesh->uv;
  bVar34 = pPVar27 == (Point2f *)0x0;
  if (!bVar34) {
    PVar14.super_Tuple2<pbrt::Point2,_float> = pPVar27[iVar33].super_Tuple2<pbrt::Point2,_float>;
    auVar35 = vmovshdup_avx512vl(auVar42);
    auVar43 = vmovshdup_avx(auVar43);
    fVar31 = uvTex.super_Tuple2<pbrt::Point2,_float>.x;
    auVar47._4_4_ = TVar10.y;
    auVar47._0_4_ = fVar31;
    auVar47._8_8_ = 0;
    PVar15.super_Tuple2<pbrt::Point2,_float> =
         pPVar27[piVar25[lVar32]].super_Tuple2<pbrt::Point2,_float>;
    PVar16.super_Tuple2<pbrt::Point2,_float> =
         pPVar27[piVar25[lVar32 + 1]].super_Tuple2<pbrt::Point2,_float>;
    auVar50._8_8_ = 0;
    auVar50._0_4_ = PVar16.super_Tuple2<pbrt::Point2,_float>.x;
    auVar50._4_4_ = PVar16.super_Tuple2<pbrt::Point2,_float>.y;
    auVar80._8_8_ = 0;
    auVar80._0_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.x;
    auVar80._4_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.y;
    auVar37 = vmulps_avx512vl(auVar35,auVar80);
    auVar38 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar31));
    auVar84._8_8_ = 0;
    auVar84._0_4_ = pPVar27[iVar24].super_Tuple2<pbrt::Point2,_float>.x;
    auVar84._4_4_ = pPVar27[iVar24].super_Tuple2<pbrt::Point2,_float>.y;
    auVar41 = vmulps_avx512vl(auVar35,auVar84);
    auVar35 = vinsertps_avx512f(auVar35,ZEXT416((uint)fVar31),0x10);
    auVar38 = vbroadcastss_avx512vl(auVar38);
    auVar78._8_8_ = 0;
    auVar78._0_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.x;
    auVar78._4_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.y;
    auVar42 = vmulps_avx512vl(auVar43,auVar78);
    auVar64._0_4_ = auVar43._0_4_ * PVar16.super_Tuple2<pbrt::Point2,_float>.x;
    auVar64._4_4_ = auVar43._4_4_ * PVar16.super_Tuple2<pbrt::Point2,_float>.y;
    auVar64._8_4_ = auVar43._8_4_ * 0.0;
    auVar64._12_4_ = auVar43._12_4_ * 0.0;
    auVar43 = vaddps_avx512vl(auVar42,auVar37);
    auVar37 = vaddps_avx512vl(auVar64,auVar41);
    auVar43 = vmulps_avx512vl(auVar38,auVar43);
    auVar38 = vpbroadcastd_avx512vl();
    auVar37 = vmulps_avx512vl(auVar37,auVar38);
    auVar43 = vaddps_avx512vl(auVar43,auVar37);
    auVar37 = vsubps_avx512vl(auVar78,auVar80);
    auVar37 = vsubps_avx512vl(auVar37,auVar50);
    uvTex.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar43);
    auVar81._8_8_ = 0;
    auVar81._0_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.x;
    auVar81._4_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.y;
    auVar43 = vinsertps_avx512f(auVar81,auVar50,0x50);
    auVar79._8_8_ = 0;
    auVar79._0_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.x;
    auVar79._4_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.y;
    auVar43 = vsubps_avx512vl(auVar43,auVar79);
    auVar37 = vaddps_avx512vl(auVar84,auVar37);
    auVar38 = vfmadd213ps_avx512vl(auVar47,auVar37,auVar43);
    auVar43 = vinsertps_avx512f(auVar50,auVar81,0x50);
    auVar43 = vsubps_avx512vl(auVar43,auVar79);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x322bcc77));
    auVar35 = vfmadd213ps_avx512vl(auVar35,auVar37,auVar43);
    auVar71._8_4_ = 0x7fffffff;
    auVar71._0_8_ = 0x7fffffff7fffffff;
    auVar71._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx512vl(auVar38,auVar71);
    uVar30 = vcmpps_avx512vl(auVar43,auVar41,5);
    auVar43 = vdivps_avx512vl(auVar44,auVar38);
    auVar37._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar43._4_4_;
    auVar37._0_4_ = (uint)((byte)uVar30 & 1) * auVar43._0_4_;
    auVar37._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar43._8_4_;
    auVar37._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar43._12_4_;
    auVar43 = vandps_avx(auVar35,auVar71);
    uVar30 = vcmpps_avx512vl(auVar43,auVar41,5);
    auVar35 = vdivps_avx512vl(auVar44,auVar35);
    fVar31 = (float)((uint)((byte)uVar30 & 1) * auVar35._0_4_);
    auVar43._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar35._4_4_;
    auVar43._0_4_ = fVar31;
    auVar43._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar35._8_4_;
    auVar43._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar35._12_4_;
    auVar35 = vbroadcastss_avx512vl(auVar37);
    auVar38 = vmulps_avx512vl(auVar39,auVar43);
    auVar43 = vmovshdup_avx(auVar43);
    auVar51._0_4_ = auVar40._0_4_ * auVar43._0_4_;
    auVar51._4_4_ = auVar40._4_4_ * auVar43._4_4_;
    auVar51._8_4_ = auVar40._8_4_ * auVar43._8_4_;
    auVar51._12_4_ = auVar40._12_4_ * auVar43._12_4_;
    auVar67._0_4_ = auVar36._0_4_ * fVar31 + auVar35._0_4_ * auVar40._0_4_;
    auVar67._4_4_ = auVar36._4_4_ * fVar31 + auVar35._4_4_ * auVar40._4_4_;
    auVar67._8_4_ = auVar36._8_4_ * fVar31 + auVar35._8_4_ * auVar40._8_4_;
    auVar67._12_4_ = auVar36._12_4_ * fVar31 + auVar35._12_4_ * auVar40._12_4_;
    auVar43 = vshufps_avx(auVar36,auVar36,0x4b);
    auVar43 = vmulps_avx512vl(auVar43,auVar37);
    auVar35 = vmovshdup_avx512vl(auVar37);
    auVar35 = vmulps_avx512vl(auVar36,auVar35);
    auVar37 = vmovshdup_avx(auVar67);
    auVar44 = vaddps_avx512vl(auVar38,auVar43);
    auVar45 = vaddps_avx512vl(auVar35,auVar51);
    auVar41 = vshufps_avx512vl(auVar44,auVar44,0xe1);
    auVar38 = vinsertps_avx512f(auVar67,auVar44,0x1c);
    auVar43 = vblendps_avx(auVar67,auVar45,2);
    auVar35 = vblendps_avx(auVar45,auVar67,2);
    auVar42 = vmovshdup_avx512vl(auVar45);
    auVar41 = vmulps_avx512vl(auVar41,auVar43);
    auVar43 = vinsertps_avx512f(auVar45,auVar44,0x4c);
    auVar35 = vfmsub213ps_fma(auVar35,auVar44,auVar41);
    auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar38,auVar41);
    auVar35 = vaddps_avx512vl(auVar35,auVar43);
    auVar41 = vxorps_avx512vl(auVar43,auVar43);
    auVar43 = ZEXT416((uint)(auVar37._0_4_ * auVar45._0_4_));
    auVar42 = vfmsub213ss_avx512f(auVar42,auVar67,auVar43);
    auVar43 = vfnmadd231ss_fma(auVar43,auVar37,auVar45);
    vaddss_avx512f(auVar42,auVar43);
    auVar43 = vucomiss_avx512f(auVar41);
    if ((bVar34) && ((POPCOUNT((ulong)pPVar27 & 0xff) & 1U) != 0)) {
      uVar30 = vcmpps_avx512vl(auVar35,ZEXT816(0) << 0x20,4);
      bVar34 = (uVar30 >> 1 & 1) == 0;
      if ((bVar34) && (bVar34 = (uVar30 & 1) == 0, bVar34)) {
        auVar36._4_4_ = local_180.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar36._0_4_ = local_180.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar36._8_8_ = 0;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_190.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar46 = vpermi2ps_avx512vl(_DAT_004ffb70,auVar36,
                                     ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar36 = vinsertps_avx(auVar46,ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>.z
                                               ),0x30);
        goto LAB_00294e56;
      }
    }
    auVar42 = vmulss_avx512f(auVar46,auVar36);
    auVar41 = vmovshdup_avx(auVar40);
    auVar49 = vmovshdup_avx512vl(auVar36);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar51 = vfmsub213ss_avx512f(auVar40,auVar39,auVar42);
    auVar42 = vfnmadd213ss_avx512f(auVar46,auVar36,auVar42);
    auVar64 = ZEXT416((uint)(local_180.super_Tuple3<pbrt::Vector3,_float>.z * auVar41._0_4_));
    auVar47 = vfmsub213ss_avx512f(auVar46,auVar49,auVar64);
    auVar39 = vfnmadd231ss_fma(auVar64,auVar39,auVar41);
    auVar46 = vmulss_avx512f(auVar49,auVar40);
    auVar42 = vaddss_avx512f(auVar42,auVar51);
    auVar36 = vfmsub213ss_fma(auVar41,auVar36,auVar46);
    auVar40 = vfnmadd213ss_avx512f(auVar40,auVar49,auVar46);
    auVar46 = vmovshdup_avx(auVar44);
    auVar39 = vaddss_avx512f(auVar47,auVar39);
    auVar41 = vmovshdup_avx512vl(auVar35);
    auVar38 = vxorps_avx512vl(auVar38,auVar50);
    auVar49 = vxorps_avx512vl(auVar37,auVar50);
    auVar51 = vxorps_avx512vl(auVar46,auVar50);
    auVar35 = vmulss_avx512f(auVar42,auVar35);
    fVar31 = auVar40._0_4_ + auVar36._0_4_;
    auVar36 = vfmadd213ss_avx512f(auVar41,auVar39,auVar35);
    auVar40 = vfmadd213ss_avx512f(auVar43,ZEXT416((uint)fVar31),auVar36);
    auVar36 = vucomiss_avx512f(auVar40);
    if (!bVar34) {
      auVar45 = vxorps_avx512vl(auVar45,auVar50);
    }
    auVar43 = vmovshdup_avx(auVar45);
    uVar13 = vcmpss_avx512f(auVar40,auVar36,1);
    bVar34 = (bool)((byte)uVar13 & 1);
    auVar36 = vmovshdup_avx512vl(auVar38);
    vb = -0.001;
    auVar48._4_12_ = auVar46._4_12_;
    auVar48._0_4_ = (float)((uint)bVar34 * auVar51._0_4_ + (uint)!bVar34 * auVar46._0_4_);
    auVar46 = ZEXT416((uint)(auVar44._0_4_ * auVar43._0_4_));
    auVar40 = vfmsub213ss_avx512f(auVar48,auVar37,auVar46);
    auVar36 = vfmadd213ss_avx512f(auVar36,auVar43,auVar46);
    auVar35 = ZEXT416((uint)(auVar37._0_4_ * auVar45._0_4_));
    auVar46 = vfmsub213ss_fma(auVar43,auVar67,auVar35);
    auVar43 = vfmadd213ss_avx512f(auVar49,auVar45,auVar35);
    auVar35 = vaddss_avx512f(auVar40,auVar36);
    auVar36 = vmulss_avx512f(auVar67,auVar48);
    auVar40 = vfmsub213ss_avx512f(auVar45,auVar44,auVar36);
    auVar36 = vfmadd213ss_avx512f(auVar38,auVar48,auVar36);
    auVar43 = vaddss_avx512f(auVar46,auVar43);
    auVar46 = vaddss_avx512f(auVar40,auVar36);
    auVar40 = vinsertps_avx512f(auVar42,auVar46,0x10);
    auVar46 = vinsertps_avx512f(auVar39,auVar35,0x10);
    auVar76._0_4_ = auVar40._0_4_ * auVar40._0_4_;
    auVar76._4_4_ = auVar40._4_4_ * auVar40._4_4_;
    auVar76._8_4_ = auVar40._8_4_ * auVar40._8_4_;
    auVar76._12_4_ = auVar40._12_4_ * auVar40._12_4_;
    auVar36 = vfmadd213ps_avx512vl(auVar46,auVar46,auVar76);
    auVar46 = vinsertps_avx(ZEXT416((uint)fVar31),auVar43,0x10);
    auVar46 = vfmadd213ps_avx512vl(auVar46,auVar46,auVar36);
    auVar36 = vsqrtps_avx(auVar46);
    auVar46 = vdivps_avx(auVar40,auVar36);
    auVar40 = vmovshdup_avx512vl(auVar36);
    auVar74._0_4_ = auVar39._0_4_ / auVar36._0_4_;
    auVar74._4_12_ = auVar39._4_12_;
    auVar72._0_4_ = fVar31 / auVar36._0_4_;
    auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar39 = vdivss_avx512f(auVar35,auVar40);
    auVar40 = vdivss_avx512f(auVar43,auVar40);
    auVar36 = vmovshdup_avx(auVar46);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar36._0_4_)),auVar74,auVar39);
    auVar46 = vfmadd231ss_fma(auVar46,auVar72,auVar40);
    dndu.super_Tuple3<pbrt::Normal3,_float>.x = auVar46._0_4_;
    if (dndu.super_Tuple3<pbrt::Normal3,_float>.x < -0.001) {
      LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.h"
                 ,0x584,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 (char (*) [6])"-1e-3",
                 (char (*) [64])"Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt)))",
                 (float *)&dndu,(char (*) [6])"-1e-3",&vb);
    }
    auVar46 = vmovlhps_avx(auVar67,auVar44);
    local_190.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar45);
    uVar13 = vmovlps_avx(auVar67);
    local_180.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar13;
    local_180.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar13 >> 0x20);
    auVar36 = vinsertps_avx(auVar46,auVar48,0x30);
    auVar40 = auVar45;
    local_190.super_Tuple3<pbrt::Vector3,_float>.z = auVar48._0_4_;
    local_180.super_Tuple3<pbrt::Vector3,_float>.z = auVar44._0_4_;
  }
LAB_00294e56:
  auVar46 = vmovshdup_avx(auVar40);
  auVar35 = vshufpd_avx(auVar36,auVar36,1);
  auVar39 = vmovshdup_avx(auVar36);
  auVar37 = vshufps_avx(auVar36,auVar36,0xff);
  auVar43 = vsubps_avx(auVar61,auVar53);
  auVar38 = vsubss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar60));
  auVar44 = vmulss_avx512f(auVar35,auVar46);
  fVar31 = auVar39._0_4_;
  auVar41 = vmulss_avx512f(auVar46,auVar46);
  auVar43 = vsubps_avx(auVar43,auVar63);
  auVar42 = vsubss_avx512f(auVar38,ZEXT416((uint)fVar2));
  auVar45 = vfmsub213ss_avx512f(auVar37,auVar39,auVar44);
  auVar44 = vfnmadd231ss_avx512f(auVar44,auVar35,auVar46);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * auVar46._0_4_)),auVar36,auVar40);
  auVar41 = vfmadd231ss_avx512f(auVar41,auVar40,auVar40);
  auVar59._0_4_ = auVar43._0_4_ + (float)(undefined4)uVar12;
  auVar59._4_4_ = auVar43._4_4_ + (float)uVar12._4_4_;
  auVar59._8_4_ = auVar43._8_4_ + 0.0;
  auVar59._12_4_ = auVar43._12_4_ + 0.0;
  auVar42 = vaddss_avx512f(auVar42,ZEXT416((uint)fVar3));
  auVar45 = vaddss_avx512f(auVar45,auVar44);
  auVar49 = vmulss_avx512f(auVar36,auVar37);
  auVar38 = vfmadd231ss_fma(auVar38,auVar35,auVar37);
  auVar41 = vfmadd231ss_avx512f(auVar41,auVar37,auVar37);
  auVar43 = vmovshdup_avx(auVar59);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar36,auVar36);
  auVar50 = vfmsub213ss_avx512f(auVar40,auVar35,auVar49);
  auVar49 = vfnmadd231ss_avx512f(auVar49,auVar36,auVar37);
  auVar44 = vfmadd231ss_fma(auVar44,auVar35,auVar35);
  auVar49 = vaddss_avx512f(auVar50,auVar49);
  auVar50 = vmulss_avx512f(auVar39,auVar40);
  auVar51 = vfmsub213ss_avx512f(auVar46,auVar36,auVar50);
  auVar50 = vfnmadd231ss_avx512f(auVar50,auVar39,auVar40);
  auVar50 = vaddss_avx512f(auVar51,auVar50);
  auVar51 = vmulss_avx512f(auVar49,auVar49);
  auVar51 = vfmadd231ss_avx512f(auVar51,auVar45,auVar45);
  auVar51 = vfmadd231ss_avx512f(auVar51,auVar50,auVar50);
  auVar51 = vsqrtss_avx512f(auVar51,auVar51);
  auVar49 = vdivss_avx512f(auVar49,auVar51);
  auVar45 = vdivss_avx512f(auVar45,auVar51);
  auVar50 = vdivss_avx512f(auVar50,auVar51);
  auVar51 = vxorps_avx512vl(auVar51,auVar51);
  auVar43 = vmulss_avx512f(auVar43,auVar49);
  auVar49 = vmulss_avx512f(auVar49,auVar51);
  auVar43 = vfmadd231ss_avx512f(auVar43,auVar45,auVar59);
  auVar45 = vfmadd231ss_avx512f(auVar49,auVar45,auVar51);
  auVar49 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)),auVar44,auVar41);
  auVar42 = vfmadd231ss_avx512f(auVar43,auVar50,auVar42);
  auVar45 = vfmadd231ss_avx512f(auVar45,auVar50,auVar51);
  auVar43 = vmulss_avx512f(auVar44,auVar42);
  auVar44 = vmulss_avx512f(auVar44,auVar45);
  auVar50 = vfmsub231ss_avx512f(auVar43,auVar45,auVar38);
  auVar43 = vfmsub231ss_fma(auVar44,auVar38,auVar42);
  auVar44 = vdivss_avx512f(ZEXT416(0x3f800000),auVar49);
  auVar49 = vmulss_avx512f(auVar41,auVar45);
  auVar41 = vmulss_avx512f(auVar41,auVar42);
  auVar42 = vfmsub231ss_avx512f(auVar49,auVar42,auVar38);
  auVar38 = vfmsub231ss_avx512f(auVar41,auVar45,auVar38);
  auVar41 = vmulss_avx512f(auVar44,auVar42);
  auVar42 = vmulss_avx512f(auVar44,auVar50);
  auVar38 = vmulss_avx512f(auVar44,auVar38);
  fVar31 = auVar43._0_4_ * auVar44._0_4_;
  auVar43 = vmulss_avx512f(auVar36,auVar41);
  auVar44 = vmulss_avx512f(auVar39,auVar41);
  auVar45 = vmulss_avx512f(auVar40,auVar42);
  auVar36 = vmulss_avx512f(auVar36,auVar38);
  auVar39 = vmulss_avx512f(auVar39,auVar38);
  auVar41 = vmulss_avx512f(auVar35,auVar41);
  auVar35 = vmulss_avx512f(auVar35,auVar38);
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = auVar36._0_4_ + auVar40._0_4_ * fVar31;
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = auVar39._0_4_ + auVar46._0_4_ * fVar31;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = auVar35._0_4_ + auVar37._0_4_ * fVar31;
  auVar39 = vaddss_avx512f(auVar43,auVar45);
  auVar40 = vmulss_avx512f(auVar46,auVar42);
  auVar43 = vmulss_avx512f(auVar37,auVar42);
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  auVar36 = vinsertps_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),0x10);
  auVar46 = vinsertps_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar60),0x10);
  auVar40 = vaddss_avx512f(auVar44,auVar40);
  auVar43 = vaddss_avx512f(auVar41,auVar43);
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = auVar39._0_4_;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = auVar40._0_4_;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = auVar43._0_4_;
  auVar46 = vandps_avx(auVar65,auVar46);
  auVar36 = vandps_avx(auVar65,auVar36);
  auVar39 = vandps_avx(auVar65,auVar63);
  auVar40 = vandps_avx(auVar65,auVar53);
  auVar43 = vandps_avx(auVar65,auVar54);
  auVar46 = vmaxps_avx(auVar36,auVar46);
  auVar36 = vmaxps_avx(auVar43,auVar40);
  auVar40 = vmovshdup_avx(auVar46);
  auVar40 = vmaxss_avx(auVar40,auVar46);
  auVar46 = vandps_avx(auVar65,auVar61);
  local_120.z = auVar40._0_4_ * 2.3841864e-07;
  auVar46 = vmaxps_avx(auVar39,auVar46);
  auVar46 = vmaxps_avx(auVar36,auVar46);
  auVar39._8_4_ = 0x34800002;
  auVar39._0_8_ = 0x3480000234800002;
  auVar39._12_4_ = 0x34800002;
  auVar46 = vmulps_avx512vl(auVar46,auVar39);
  local_120._0_8_ = vmovlps_avx(auVar46);
  if (mesh->faceIndices == (int *)0x0) {
    iVar33 = 0;
  }
  else {
    iVar33 = mesh->faceIndices[patchIndex];
  }
  bVar34 = mesh->reverseOrientation;
  bVar23 = mesh->transformSwapsHandedness;
  local_170 = time;
  Point3fi::Point3fi((Point3fi *)&vb,(Point3f *)&local_110,(Vector3f *)&local_120);
  SurfaceInteraction::SurfaceInteraction
            (__return_storage_ptr__,(Point3fi *)&vb,&uvTex,wo,&local_180,&local_190,&dndu,&dndv,
             local_170,bVar34 != bVar23);
  __return_storage_ptr__->faceIndex = iVar33;
  pNVar28 = mesh->n;
  bVar34 = pNVar28 != (Normal3f *)0x0;
  if (bVar34) {
    fVar60 = pNVar28[piVar25[lVar32]].super_Tuple3<pbrt::Normal3,_float>.z;
    uVar6 = pNVar28[piVar25[lVar32]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar19 = pNVar28[piVar25[lVar32]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar7 = pNVar28[piVar25[lVar32 + 2]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar20 = pNVar28[piVar25[lVar32 + 2]].super_Tuple3<pbrt::Normal3,_float>.y;
    fVar1 = pNVar28[piVar25[lVar32 + 2]].super_Tuple3<pbrt::Normal3,_float>.z;
    uVar8 = pNVar28[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar21 = pNVar28[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Normal3,_float>.y;
    uVar9 = pNVar28[piVar25[lVar32 + 3]].super_Tuple3<pbrt::Normal3,_float>.x;
    uVar22 = pNVar28[piVar25[lVar32 + 3]].super_Tuple3<pbrt::Normal3,_float>.y;
    fVar2 = pNVar28[piVar25[lVar32 + 1]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar3 = pNVar28[piVar25[lVar32 + 3]].super_Tuple3<pbrt::Normal3,_float>.z;
    fVar31 = (uv->super_Tuple2<pbrt::Point2,_float>).y;
    auVar68._4_4_ = fVar31;
    auVar68._0_4_ = fVar31;
    auVar68._8_4_ = fVar31;
    auVar68._12_4_ = fVar31;
    fVar4 = (uv->super_Tuple2<pbrt::Point2,_float>).x;
    auVar62._4_4_ = fVar4;
    auVar62._0_4_ = fVar4;
    auVar62._8_4_ = fVar4;
    auVar62._12_4_ = fVar4;
    auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar68);
    fVar70 = auVar46._0_4_;
    auVar66._0_4_ = fVar31 * (float)uVar7 + fVar70 * (float)uVar6;
    auVar66._4_4_ = fVar31 * (float)uVar20 + fVar70 * (float)uVar19;
    auVar66._8_4_ = fVar31 * 0.0 + fVar70 * 0.0;
    auVar66._12_4_ = fVar31 * 0.0 + fVar70 * 0.0;
    auVar36 = vmovshdup_avx512vl(auVar66);
    auVar77._0_4_ = fVar31 * (float)uVar9 + fVar70 * (float)uVar8;
    auVar77._4_4_ = fVar31 * (float)uVar22 + fVar70 * (float)uVar21;
    auVar77._8_4_ = fVar31 * 0.0 + fVar70 * 0.0;
    auVar77._12_4_ = fVar31 * 0.0 + fVar70 * 0.0;
    auVar39 = vaddss_avx512f(ZEXT416((uint)(fVar3 * fVar31)),ZEXT416((uint)(fVar70 * fVar2)));
    auVar40 = vsubss_avx512f(ZEXT416(0x3f800000),auVar62);
    auVar46 = vmovshdup_avx(auVar77);
    auVar36 = vmulss_avx512f(auVar40,auVar36);
    fVar29 = auVar36._0_4_ + auVar46._0_4_ * fVar4;
    fVar73 = auVar40._0_4_;
    auVar69._4_4_ = fVar73;
    auVar69._0_4_ = fVar73;
    auVar69._8_4_ = fVar73;
    auVar69._12_4_ = fVar73;
    auVar35 = ZEXT416((uint)(fVar31 * fVar1 + fVar70 * fVar60));
    auVar46 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar35);
    auVar36 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar77,auVar39);
    auVar46 = vmulps_avx512vl(auVar69,auVar46);
    auVar75._0_4_ = auVar36._0_4_ * fVar4;
    auVar75._4_4_ = auVar36._4_4_ * fVar4;
    auVar75._8_4_ = auVar36._8_4_ * fVar4;
    auVar75._12_4_ = auVar36._12_4_ * fVar4;
    auVar36 = vaddps_avx512vl(auVar46,auVar75);
    auVar46 = vmulss_avx512f(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
    auVar40 = vmulps_avx512vl(auVar36,auVar36);
    auVar43 = vmovshdup_avx512vl(auVar40);
    auVar46 = vaddss_avx512f(auVar43,auVar46);
    vaddss_avx512f(auVar46,auVar40);
    auVar46 = vxorps_avx512vl(auVar40,auVar40);
    auVar46 = vucomiss_avx512f(auVar46);
    if (bVar34) {
      auVar46 = vsqrtss_avx512f(auVar46,auVar46);
      fVar31 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar17._0_4_ = (__return_storage_ptr__->super_Interaction).n.
                     super_Tuple3<pbrt::Normal3,_float>.y;
      uVar17._4_4_ = (__return_storage_ptr__->super_Interaction).n.
                     super_Tuple3<pbrt::Normal3,_float>.z;
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
      auVar43 = vdivss_avx512f(ZEXT416((uint)fVar29),auVar46);
      auVar46 = vbroadcastss_avx512vl(auVar46);
      auVar36 = vdivps_avx512vl(auVar36,auVar46);
      auVar37 = vshufps_avx512vl(auVar36,auVar36,0xe1);
      auVar46 = vinsertps_avx512f(auVar37,auVar43,0x10);
      auVar52._4_12_ = auVar37._4_12_;
      auVar52._0_4_ = auVar43._0_4_;
      local_130._0_8_ = vmovlps_avx512f(auVar46);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar17;
      auVar46 = vmulps_avx512vl(auVar82,auVar82);
      local_130.z = auVar36._0_4_;
      auVar40 = vaddss_avx512f(auVar40,auVar46);
      auVar46 = vmovshdup_avx512vl(auVar46);
      auVar46 = vaddss_avx512f(auVar40,auVar46);
      auVar46 = vsqrtss_avx512f(auVar46,auVar46);
      auVar40 = vdivss_avx512f(ZEXT416((uint)fVar31),auVar46);
      auVar46 = vbroadcastss_avx512vl(auVar46);
      auVar37 = vmovshdup_avx512vl(auVar36);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar17;
      auVar38 = vdivps_avx512vl(auVar83,auVar46);
      auVar46 = vpermi2ps_avx512vl(_DAT_004ffad0,auVar38,auVar40);
      auVar53 = vmulps_avx512vl(auVar52,auVar46);
      auVar54 = vfmsub213ps_avx512vl(auVar36,auVar38,auVar53);
      auVar46 = vfnmadd213ps_avx512vl(auVar46,auVar52,auVar53);
      auVar53 = vaddps_avx512vl(auVar54,auVar46);
      auVar46 = vmulss_avx512f(auVar37,auVar38);
      auVar54 = vfmsub213ss_avx512f(auVar43,auVar40,auVar46);
      auVar46 = vfnmadd231ss_avx512f(auVar46,auVar38,auVar37);
      auVar54 = vaddss_avx512f(auVar54,auVar46);
      auVar46 = vmulps_avx512vl(auVar53,auVar53);
      auVar46 = vmovshdup_avx512vl(auVar46);
      auVar46 = vfmadd231ss_avx512f(auVar46,auVar53,auVar53);
      vfmadd231ss_avx512f(auVar46,auVar54,auVar54);
      auVar46 = vucomiss_avx512f(ZEXT416(0x283424dc));
      if (bVar34) {
        auVar61 = vsubps_avx(auVar77,auVar66);
        auVar39 = vsubss_avx512f(auVar39,auVar35);
        auVar58._0_4_ = (float)uVar8 * fVar4 + fVar73 * (float)uVar6;
        auVar58._4_4_ = (float)uVar21 * fVar4 + fVar73 * (float)uVar19;
        auVar58._8_4_ = fVar4 * 0.0 + fVar73 * 0.0;
        auVar58._12_4_ = fVar4 * 0.0 + fVar73 * 0.0;
        local_d0._0_8_ = vmovlps_avx(auVar61);
        local_d0.z = auVar39._0_4_;
        auVar56._0_4_ = (float)uVar9 * fVar4 + fVar73 * (float)uVar7;
        auVar56._4_4_ = (float)uVar22 * fVar4 + fVar73 * (float)uVar20;
        auVar56._8_4_ = fVar4 * 0.0 + fVar73 * 0.0;
        auVar56._12_4_ = fVar4 * 0.0 + fVar73 * 0.0;
        local_e0.z = (fVar3 * fVar4 + fVar73 * fVar1) - (fVar2 * fVar4 + fVar73 * fVar60);
        auVar39 = vsubps_avx(auVar56,auVar58);
        local_e0._0_8_ = vmovlps_avx(auVar39);
        auVar46 = vsqrtss_avx512f(auVar46,auVar46);
        uVar55 = auVar46._0_4_;
        auVar57._4_4_ = uVar55;
        auVar57._0_4_ = uVar55;
        auVar57._8_4_ = uVar55;
        auVar57._12_4_ = uVar55;
        auVar46 = vdivss_avx512f(auVar54,auVar46);
        auVar39 = vdivps_avx512vl(auVar53,auVar57);
        local_c0._0_8_ = vmovlps_avx(auVar39);
        local_c0.z = auVar46._0_4_;
        auVar46 = vmovshdup_avx512vl(auVar38);
        auVar35 = ZEXT416((uint)(local_130.z * auVar46._0_4_));
        auVar39 = vfmadd213ss_avx512f(auVar43,auVar38,auVar35);
        auVar46 = vfmsub213ss_fma(auVar46,auVar36,auVar35);
        auVar36 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ + auVar46._0_4_)),auVar40,auVar37
                                     );
        auVar46 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar36,auVar36);
        auVar46 = vmaxss_avx(auVar46,ZEXT416(0) << 0x20);
        auVar46 = vsqrtss_avx(auVar46,auVar46);
        Rotate((Transform *)&vb,auVar46._0_4_,auVar36._0_4_,(Vector3f *)&local_c0);
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(local_180.super_Tuple3<pbrt::Vector3,_float>.y *
                                                vb._4_4_)),ZEXT416(vb._0_4_),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(local_9c *
                                                local_180.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_a0),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(local_8c *
                                                local_180.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_90),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar40 = vfmadd231ss_fma(auVar46,ZEXT416((uint)local_a8),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)local_98),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)local_88),
                                  ZEXT416((uint)local_180.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(local_190.super_Tuple3<pbrt::Vector3,_float>.y *
                                                vb._4_4_)),
                                  ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416(vb._0_4_));
        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_9c *
                                                local_190.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)local_a0));
        auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>
                                                        .z),ZEXT416((uint)local_a8));
        auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>
                                                        .z),ZEXT416((uint)local_98));
        auVar46 = vinsertps_avx(auVar46,auVar43,0x10);
        local_100._0_8_ = vmovlps_avx(auVar46);
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(local_8c *
                                                local_190.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  ZEXT416((uint)local_90),
                                  ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>.x));
        auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)local_88),
                                  ZEXT416((uint)local_190.super_Tuple3<pbrt::Vector3,_float>.z));
        local_100.z = auVar46._0_4_;
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * local_130.y)),auVar40,
                                  ZEXT416((uint)local_130.x));
        auVar46 = vfmadd231ss_fma(auVar46,auVar39,ZEXT416((uint)local_130.z));
        fVar60 = auVar46._0_4_;
        local_f0.z = auVar39._0_4_ - local_130.z * fVar60;
        auVar46 = vinsertps_avx(ZEXT416((uint)(auVar40._0_4_ - local_130.x * fVar60)),
                                ZEXT416((uint)(auVar36._0_4_ - local_130.y * fVar60)),0x10);
        local_f0._0_8_ = vmovlps_avx(auVar46);
        SurfaceInteraction::SetShadingGeometry
                  (__return_storage_ptr__,(Normal3f *)&local_130,(Vector3f *)&local_f0,
                   (Vector3f *)&local_100,(Normal3f *)&local_d0,(Normal3f *)&local_e0,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex,
                                                          const Point2f &uv, Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }